

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O3

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetCameraResolution
          (VClient *this,string *i_rCameraName,uint *o_rResolutionX,uint *o_rResolutionY)

{
  Enum EVar1;
  bool bVar2;
  VCameraInfo *pVVar3;
  Enum GetResult;
  scoped_lock Lock;
  Enum local_34;
  unique_lock<boost::recursive_mutex> local_30;
  
  local_30.m = &this->m_FrameMutex;
  local_30.is_locked = false;
  boost::unique_lock<boost::recursive_mutex>::lock(&local_30);
  local_34 = Success;
  ClientUtils::Clear(o_rResolutionX);
  ClientUtils::Clear(o_rResolutionY);
  bVar2 = InitGet(this,&local_34);
  if (bVar2) {
    pVVar3 = GetCamera(this,i_rCameraName,&local_34);
    if (pVVar3 != (VCameraInfo *)0x0) {
      *o_rResolutionX = pVVar3->m_ResolutionX;
      *o_rResolutionY = pVVar3->m_ResolutionY;
    }
  }
  EVar1 = local_34;
  if (local_30.is_locked == true) {
    boost::recursive_mutex::unlock(local_30.m);
  }
  return EVar1;
}

Assistant:

Result::Enum VClient::GetCameraResolution( const std::string & i_rCameraName, unsigned int & o_rResolutionX, unsigned int & o_rResolutionY ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );

  Result::Enum GetResult = Result::Success;
  if( InitGet( GetResult, o_rResolutionX, o_rResolutionY ) )
  {
    const ViconCGStream::VCameraInfo* pCamera = GetCamera( i_rCameraName, GetResult );
    if( !pCamera )
    {
      return GetResult;
    }

    o_rResolutionX = pCamera->m_ResolutionX;
    o_rResolutionY = pCamera->m_ResolutionY;
  }

  return GetResult;
}